

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha.c
# Opt level: O0

int chacha_test_multiblock(chacha_key *key,chacha_iv *iv,uint8_t *in,uint8_t *out)

{
  int iVar1;
  size_t sVar2;
  chacha_state *in_RCX;
  uint8_t *p;
  uint8_t final [64];
  chacha_state st;
  chacha_key *in_stack_ffffffffffffff08;
  undefined1 local_e8 [8];
  size_t in_stack_ffffffffffffff20;
  uint8_t *in_stack_ffffffffffffff28;
  uint8_t *in_stack_ffffffffffffff30;
  uint8_t *in_stack_ffffffffffffff38;
  chacha_state *in_stack_ffffffffffffff40;
  
  memset(in_RCX,0,0x800);
  chacha_test_init_state(in_RCX,in_stack_ffffffffffffff08,(chacha_iv *)0x262162);
  sVar2 = chacha_update(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                        in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28);
  chacha_final((chacha_state *)(in_RCX->opaque + sVar2),in_stack_ffffffffffffff08->b);
  chacha_test_compact_array
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  iVar1 = memcmp(expected_chacha,local_e8,0x40);
  return (uint)(iVar1 == 0);
}

Assistant:

static int
chacha_test_multiblock(chacha_key *key, chacha_iv *iv, const uint8_t *in, uint8_t *out) {
    chacha_state st;
    uint8_t final[CHACHA_BLOCKBYTES];
    uint8_t *p = out;

    memset(out, 0, CHACHA_TEST_LEN);
    chacha_test_init_state(&st, key, iv);
    p += chacha_update(&st, in, p, CHACHA_TEST_LEN);
    chacha_final(&st, p);
    chacha_test_compact_array(final, out, CHACHA_TEST_LEN);
    return (memcmp(expected_chacha, final, sizeof(expected_chacha)) == 0) ? 1 : 0;
}